

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O0

int ON_ParseLengthExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,double *length_value,
              ON_ParseSettings *parse_results,LengthUnitSystem *str_length_unit_system)

{
  ON_ParseSettings OVar1;
  ON_ParseSettings parse_settings_00;
  ON__UINT32 aOVar2 [2];
  ON__UINT32 aOVar3 [2];
  undefined8 uVar4;
  ON__UINT16 OVar5;
  ON__UINT8 OVar6;
  ON__UINT8 OVar7;
  ON__UINT64 OVar8;
  undefined8 uVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  double dVar13;
  bool local_18a;
  bool local_189;
  bool local_15d;
  int end_of_inches_index;
  undefined1 auStack_158 [3];
  bool bParseWhiteSpaceBetweenFeetAndInches;
  int number_dash_count;
  ON_ParseSettings inches_pr;
  double dStack_130;
  LengthUnitSystem inches_us;
  double inches_value;
  ON_ParseSettings parse_inches;
  int inches_index0;
  undefined1 auStack_d8 [4];
  int end_of_unit_index;
  ON_ParseSettings parse_unit_name_settings;
  bool bParseWhiteSpaceBetweenValueAndUnitSystem;
  int local_8c;
  undefined1 auStack_88 [4];
  int str_index;
  ON_ParseSettings pr;
  ON_ParseSettings input_parse_settings;
  double dStack_40;
  LengthUnitSystem length_us;
  double x;
  LengthUnitSystem *str_length_unit_system_local;
  ON_ParseSettings *parse_results_local;
  double *length_value_local;
  wchar_t *pwStack_18;
  int str_count_local;
  wchar_t *str_local;
  
  OVar1 = parse_settings;
  OVar8 = ON_ParseSettings::FalseSettings.m_reserved;
  uVar4 = ON_ParseSettings::FalseSettings._16_8_;
  aOVar3 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar2 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  dStack_40 = -1.23432101234321e+308;
  input_parse_settings.m_reserved._7_1_ = '\0';
  pr.m_reserved._0_4_ = parse_settings.m_true_default_bits[0];
  pr.m_reserved._4_4_ = parse_settings.m_true_default_bits[1];
  input_parse_settings.m_true_default_bits[0] = parse_settings.m_false_default_bits[0];
  input_parse_settings.m_true_default_bits[1] = parse_settings.m_false_default_bits[1];
  input_parse_settings.m_false_default_bits = (ON__UINT32  [2])parse_settings._16_8_;
  input_parse_settings.m_reserved_bits = (undefined4)parse_settings.m_reserved;
  input_parse_settings.m_context_locale_id = parse_settings.m_reserved._4_2_;
  input_parse_settings.m_context_angle_unit_system = parse_settings.m_reserved._6_1_;
  input_parse_settings.m_context_length_unit_system = parse_settings.m_reserved._7_1_;
  _auStack_88 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  pr.m_true_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
  pr.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
  pr._16_8_ = ON_ParseSettings::FalseSettings.m_reserved;
  if (length_value != (double *)0x0) {
    *length_value = -1.23432101234321e+308;
  }
  if (str_length_unit_system != (LengthUnitSystem *)0x0) {
    *str_length_unit_system = None;
  }
  if (parse_results != (ON_ParseSettings *)0x0) {
    *&parse_results->m_true_default_bits = aOVar2;
    *&parse_results->m_false_default_bits = aOVar3;
    uVar9 = ON_ParseSettings::FalseSettings._16_8_;
    ON_ParseSettings::FalseSettings.m_reserved_bits = (ON__UINT32)uVar4;
    ON_ParseSettings::FalseSettings.m_context_locale_id = SUB82(uVar4,4);
    OVar5 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    ON_ParseSettings::FalseSettings.m_context_angle_unit_system = SUB81(uVar4,6);
    OVar6 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    ON_ParseSettings::FalseSettings.m_context_length_unit_system = SUB81(uVar4,7);
    OVar7 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    ON_ParseSettings::FalseSettings._16_8_ = uVar9;
    parse_results->m_context_locale_id = OVar5;
    parse_results->m_context_angle_unit_system = OVar6;
    parse_results->m_context_length_unit_system = OVar7;
    parse_results->m_reserved = OVar8;
  }
  x = (double)str_length_unit_system;
  str_length_unit_system_local = (LengthUnitSystem *)parse_results;
  parse_results_local = (ON_ParseSettings *)length_value;
  length_value_local._4_4_ = str_count;
  pwStack_18 = str;
  local_8c = ON_ParseNumberExpression
                       (str,str_count,OVar1,(ON_ParseSettings *)auStack_88,&stack0xffffffffffffffc0)
  ;
  if (local_8c < 1) {
    str_local._4_4_ = 0;
  }
  else {
    if (length_value_local._4_4_ != -1) {
      if (length_value_local._4_4_ < local_8c) {
        return 0;
      }
      length_value_local._4_4_ = length_value_local._4_4_ - local_8c;
    }
    if ((local_8c < length_value_local._4_4_) || (local_189 = false, length_value_local._4_4_ == -1)
       ) {
      bVar10 = ON_ParseSettings::ParseWhiteSpaceBetweenValueAndUnitSystem
                         ((ON_ParseSettings *)&pr.m_reserved);
      local_189 = false;
      if (bVar10) {
        local_189 = ON_ParseSettings::IsInteriorWhiteSpace
                              ((ON_ParseSettings *)&pr.m_reserved,pwStack_18[local_8c]);
      }
    }
    parse_unit_name_settings.m_reserved._7_1_ = local_189;
    auStack_d8 = (undefined1  [4])(undefined4)pr.m_reserved;
    end_of_unit_index = pr.m_reserved._4_4_;
    parse_unit_name_settings.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
    parse_unit_name_settings.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
    parse_unit_name_settings.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
    parse_unit_name_settings.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
    parse_unit_name_settings.m_reserved_bits = input_parse_settings.m_reserved_bits;
    parse_unit_name_settings.m_context_locale_id = input_parse_settings.m_context_locale_id;
    parse_unit_name_settings.m_context_angle_unit_system =
         input_parse_settings.m_context_angle_unit_system;
    parse_unit_name_settings.m_context_length_unit_system =
         input_parse_settings.m_context_length_unit_system;
    ON_ParseSettings::SetParseLeadingWhiteSpace((ON_ParseSettings *)auStack_d8,false);
    ON_ParseSettings::SetParseWhiteSpaceBetweenValueAndUnitSystem
              ((ON_ParseSettings *)auStack_d8,(bool)(parse_unit_name_settings.m_reserved._7_1_ & 1))
    ;
    OVar1.m_false_default_bits[0] = parse_unit_name_settings.m_true_default_bits[0];
    OVar1.m_false_default_bits[1] = parse_unit_name_settings.m_true_default_bits[1];
    OVar1.m_true_default_bits[0] = (ON__UINT32)auStack_d8;
    OVar1.m_true_default_bits[1] = end_of_unit_index;
    OVar1._16_8_ = parse_unit_name_settings.m_false_default_bits;
    OVar1.m_reserved._0_4_ = parse_unit_name_settings.m_reserved_bits;
    OVar1.m_reserved._4_2_ = parse_unit_name_settings.m_context_locale_id;
    OVar1.m_reserved._6_1_ = parse_unit_name_settings.m_context_angle_unit_system;
    OVar1.m_reserved._7_1_ = parse_unit_name_settings.m_context_length_unit_system;
    iVar12 = ON_ParseLengthUnitName
                       (pwStack_18 + local_8c,length_value_local._4_4_,OVar1,
                        (LengthUnitSystem *)((long)&input_parse_settings.m_reserved + 7));
    if (iVar12 < 1) {
      input_parse_settings.m_reserved._7_1_ = '\0';
    }
    else {
      if (length_value_local._4_4_ != -1) {
        if (length_value_local._4_4_ < iVar12) {
          return 0;
        }
        length_value_local._4_4_ = length_value_local._4_4_ - iVar12;
      }
      local_8c = iVar12 + local_8c;
      ON_ParseSettings::SetParseWhiteSpaceBetweenValueAndUnitSystem
                ((ON_ParseSettings *)auStack_88,
                 (bool)(parse_unit_name_settings.m_reserved._7_1_ & 1));
      if (((length_value_local._4_4_ == -1) || (0 < length_value_local._4_4_)) &&
         (input_parse_settings.m_reserved._7_1_ == '\t')) {
        dVar13 = floor(dStack_40);
        if (((((dVar13 == dStack_40) && (!NAN(dVar13) && !NAN(dStack_40))) &&
             ((bVar10 = ON_ParseSettings::ParseFeetInches((ON_ParseSettings *)&pr.m_reserved),
              bVar10 && ((bVar10 = ON_ParseSettings::ParseSignificandDecimalPoint
                                             ((ON_ParseSettings *)auStack_88), !bVar10 &&
                         (bVar10 = ON_ParseSettings::ParseScientificENotation
                                             ((ON_ParseSettings *)auStack_88), !bVar10)))))) &&
            (bVar10 = ON_ParseSettings::ParseRationalNumber((ON_ParseSettings *)auStack_88), !bVar10
            )) && ((((bVar10 = ON_ParseSettings::ParseMultiplication((ON_ParseSettings *)auStack_88)
                     , !bVar10 &&
                     (bVar10 = ON_ParseSettings::ParseDivision((ON_ParseSettings *)auStack_88),
                     !bVar10)) &&
                    (bVar10 = ON_ParseSettings::ParsePi((ON_ParseSettings *)auStack_88), !bVar10))
                   && (bVar10 = ON_ParseSettings::ParseIntegerDashFraction
                                          ((ON_ParseSettings *)auStack_88), !bVar10)))) {
          inches_value = (double)pr.m_reserved;
          parse_inches.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
          parse_inches.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
          parse_inches.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
          parse_inches.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
          parse_inches.m_reserved_bits = input_parse_settings.m_reserved_bits;
          parse_inches.m_context_locale_id = input_parse_settings.m_context_locale_id;
          parse_inches.m_context_angle_unit_system =
               input_parse_settings.m_context_angle_unit_system;
          parse_inches.m_context_length_unit_system =
               input_parse_settings.m_context_length_unit_system;
          parse_inches.m_reserved._4_4_ = local_8c;
          DisableStartAndExpressionParsingStuff((ON_ParseSettings *)&inches_value);
          ON_ParseSettings::SetParsePi((ON_ParseSettings *)&inches_value,false);
          ON_ParseSettings::SetParseFeetInches((ON_ParseSettings *)&inches_value,false);
          dStack_130 = -1.23432101234321e+308;
          inches_pr.m_reserved._7_1_ = '\0';
          _auStack_158 = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
          number_dash_count = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
          inches_pr.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0]
          ;
          inches_pr.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1]
          ;
          inches_pr.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
          inches_pr.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
          inches_pr.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
          inches_pr.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
          inches_pr.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
          end_of_inches_index = 0;
          bVar10 = ON_ParseSettings::IsNumberDash
                             ((ON_ParseSettings *)&pr.m_reserved,
                              pwStack_18[parse_inches.m_reserved._4_4_]);
          if ((bVar10) && ((length_value_local._4_4_ == -1 || (2 < length_value_local._4_4_)))) {
            cVar11 = ON_ParseSettings::IsDigit
                               ((ON_ParseSettings *)&pr.m_reserved,
                                pwStack_18[parse_inches.m_reserved._4_4_ + 1]);
            end_of_inches_index = (int)(cVar11 != '\0');
            if (length_value_local._4_4_ != -1) {
              length_value_local._4_4_ = length_value_local._4_4_ + -1;
            }
          }
          local_15d = false;
          if ((end_of_inches_index == 0) &&
             ((length_value_local._4_4_ == -1 || (2 < length_value_local._4_4_)))) {
            if ((local_8c < length_value_local._4_4_) ||
               (local_18a = false, length_value_local._4_4_ == -1)) {
              bVar10 = ON_ParseSettings::ParseWhiteSpaceBetweenFeetAndInches
                                 ((ON_ParseSettings *)&pr.m_reserved);
              local_18a = false;
              if (bVar10) {
                local_18a = ON_ParseSettings::IsInteriorWhiteSpace
                                      ((ON_ParseSettings *)&pr.m_reserved,
                                       pwStack_18[parse_inches.m_reserved._4_4_]);
              }
            }
            local_15d = local_18a;
            ON_ParseSettings::SetParseLeadingWhiteSpace((ON_ParseSettings *)&inches_value,local_18a)
            ;
          }
          parse_settings_00.m_false_default_bits[0] = parse_inches.m_true_default_bits[0];
          parse_settings_00.m_false_default_bits[1] = parse_inches.m_true_default_bits[1];
          parse_settings_00.m_true_default_bits = (ON__UINT32  [2])inches_value;
          parse_settings_00._16_8_ = parse_inches.m_false_default_bits;
          parse_settings_00.m_reserved._0_4_ = parse_inches.m_reserved_bits;
          parse_settings_00.m_reserved._4_2_ = parse_inches.m_context_locale_id;
          parse_settings_00.m_reserved._6_1_ = parse_inches.m_context_angle_unit_system;
          parse_settings_00.m_reserved._7_1_ = parse_inches.m_context_length_unit_system;
          iVar12 = ON_ParseLengthExpression
                             (pwStack_18 +
                              (long)parse_inches.m_reserved._4_4_ + (long)end_of_inches_index,
                              length_value_local._4_4_,parse_settings_00,&stack0xfffffffffffffed0,
                              (ON_ParseSettings *)auStack_158,
                              (LengthUnitSystem *)((long)&inches_pr.m_reserved + 7));
          if (((((0 < iVar12) && (inches_pr.m_reserved._7_1_ == '\0')) && (0.0 <= dStack_130)) &&
              ((dStack_130 < 12.0 &&
               (L'/' < pwStack_18[parse_inches.m_reserved._4_4_ + end_of_inches_index])))) &&
             (pwStack_18[parse_inches.m_reserved._4_4_ + end_of_inches_index] < L':')) {
            inches_pr.m_reserved._7_1_ = '\b';
          }
          if (((0 < iVar12) && (inches_pr.m_reserved._7_1_ == '\b')) &&
             ((0.0 <= dStack_130 && (dStack_130 < 12.0)))) {
            local_8c = parse_inches.m_reserved._4_4_ + iVar12 + end_of_inches_index;
            if ((0.0 <= dStack_40) || (dStack_130 <= 0.0)) {
              dStack_40 = dStack_40 * 12.0 + dStack_130;
            }
            else {
              dStack_40 = dStack_40 * 12.0 + -dStack_130;
            }
            input_parse_settings.m_reserved._7_1_ = '\b';
            ON_ParseSettings::SetParseFeetInches((ON_ParseSettings *)auStack_88,true);
            ON_ParseSettings::SetParseLeadingWhiteSpace((ON_ParseSettings *)auStack_158,false);
            ON_ParseSettings::operator|=
                      ((ON_ParseSettings *)auStack_88,(ON_ParseSettings *)auStack_158);
            ON_ParseSettings::SetParseWhiteSpaceBetweenFeetAndInches
                      ((ON_ParseSettings *)auStack_88,local_15d);
          }
        }
      }
    }
    if (parse_results_local != (ON_ParseSettings *)0x0) {
      *(double *)parse_results_local->m_true_default_bits = dStack_40;
    }
    if (str_length_unit_system_local != (LengthUnitSystem *)0x0) {
      *(ON__UINT32 (*) [2])str_length_unit_system_local = _auStack_88;
      *(ON__UINT32 (*) [2])(str_length_unit_system_local + 8) = pr.m_true_default_bits;
      *(ON__UINT32 (*) [2])(str_length_unit_system_local + 0x10) = pr.m_false_default_bits;
      *(undefined8 *)(str_length_unit_system_local + 0x18) = pr._16_8_;
    }
    if (x != 0.0) {
      *(char *)x = input_parse_settings.m_reserved._7_1_;
    }
    str_local._4_4_ = local_8c;
  }
  return str_local._4_4_;
}

Assistant:

int ON_ParseLengthExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  double* length_value,
  ON_ParseSettings* parse_results,
  ON::LengthUnitSystem* str_length_unit_system
  )
{
  double x = ON_UNSET_VALUE;
  ON::LengthUnitSystem length_us = ON::LengthUnitSystem::None;
  const ON_ParseSettings input_parse_settings(parse_settings);
  ON_ParseSettings pr = ON_ParseSettings::FalseSettings;
  if ( 0 != length_value )
    *length_value = ON_UNSET_VALUE;
  if ( 0 != str_length_unit_system )
    *str_length_unit_system = length_us;
  if ( 0 != parse_results )
    *parse_results = pr;

  int str_index = ON_ParseNumberExpression(str,str_count,input_parse_settings,&pr,&x);
  if ( str_index <= 0 )
    return 0;

  if ( -1 != str_count )
  {
    if (str_index > str_count )
      return 0;
    str_count -= str_index;
  }

  const bool bParseWhiteSpaceBetweenValueAndUnitSystem
    = (str_index < str_count || -1 == str_count)
    && input_parse_settings.ParseWhiteSpaceBetweenValueAndUnitSystem()
    && input_parse_settings.IsInteriorWhiteSpace(str[str_index]);
  ON_ParseSettings parse_unit_name_settings(input_parse_settings);
  parse_unit_name_settings.SetParseLeadingWhiteSpace(false);
  parse_unit_name_settings.SetParseWhiteSpaceBetweenValueAndUnitSystem(bParseWhiteSpaceBetweenValueAndUnitSystem);
  
  const int end_of_unit_index = ON_ParseLengthUnitName(
    str+str_index,
    str_count,
    parse_unit_name_settings,
    &length_us
  );

  if ( end_of_unit_index > 0 )
  {
    if ( -1 != str_count )
    {
      if (end_of_unit_index > str_count )
        return 0;
      str_count -= end_of_unit_index;
    }
    str_index += end_of_unit_index;

    pr.SetParseWhiteSpaceBetweenValueAndUnitSystem(bParseWhiteSpaceBetweenValueAndUnitSystem);

    if ( -1 == str_count || str_count > 0 )
    {
      if ( ON::LengthUnitSystem::Feet == length_us 
           && floor(x) == x
           && input_parse_settings.ParseFeetInches() 
           && false == pr.ParseSignificandDecimalPoint()
           && false == pr.ParseScientificENotation()
           && false == pr.ParseRationalNumber()
           && false == pr.ParseMultiplication()
           && false == pr.ParseDivision()
           && false == pr.ParsePi()
           && false == pr.ParseIntegerDashFraction()
         )
      {
        // parse inches part or feet and inches
        int inches_index0 = str_index;
        ON_ParseSettings parse_inches = input_parse_settings;
        DisableStartAndExpressionParsingStuff(parse_inches);
        parse_inches.SetParsePi(false);
        parse_inches.SetParseFeetInches(false);

        double inches_value = ON_UNSET_VALUE;
        ON::LengthUnitSystem inches_us = ON::LengthUnitSystem::None;
        ON_ParseSettings inches_pr = ON_ParseSettings::FalseSettings;


        // Dale Lear 9 April 2014 - fix RH-23095 
        //  Checking for a number dash is required to parse 1'-1-1/2" as 13.5 inches.
        int number_dash_count = 0;
        if ( input_parse_settings.IsNumberDash(str[inches_index0]) )
        {
          // It is intentional that the "number dash" between feet and inches
          // cannot have leading or trailing interior space.
          if (-1 == str_count || str_count >= 3)
          {
            if ( input_parse_settings.IsDigit(str[inches_index0 + 1]) )
              number_dash_count = 1;
            if (-1 != str_count)
              str_count--;
          }
        }


        // June 10, 2016 Dale Lear
        // http://mcneel.myjetbrains.com/youtrack/issue/RH-34577
        //  Allow embedded interior white space between the feet and inches.
        //  Example <1' 3"> should parse as 15 inches.
        bool bParseWhiteSpaceBetweenFeetAndInches = false;
        if (0 == number_dash_count)
        {
          if (-1 == str_count || str_count >= 3)
          {
            bParseWhiteSpaceBetweenFeetAndInches
              = (str_index < str_count || -1 == str_count)
              && input_parse_settings.ParseWhiteSpaceBetweenFeetAndInches()
              && input_parse_settings.IsInteriorWhiteSpace(str[inches_index0]);
            parse_inches.SetParseLeadingWhiteSpace(bParseWhiteSpaceBetweenFeetAndInches);
          }
        }

        int end_of_inches_index = ON_ParseLengthExpression(
          str + inches_index0 + number_dash_count,
          str_count,
          parse_inches,&inches_value,&inches_pr,&inches_us);

        if (
          end_of_inches_index > 0
          && ON::LengthUnitSystem::None == inches_us
          && inches_value >= 0.0
          && inches_value < 12.0
          && str[inches_index0 + number_dash_count] >= '0'
          && str[inches_index0 + number_dash_count] <= '9'
          )
        {
          // "lazy" inches format 1'6 is parsed as 1'6"
          inches_us = ON::LengthUnitSystem::Inches;
        }

        if ( end_of_inches_index > 0 
             && ON::LengthUnitSystem::Inches == inches_us
             && inches_value >= 0.0 // Dale Lear: 1'0" parses as 12 inches http://mcneel.myjetbrains.com/youtrack/issue/RH-34577
             && inches_value < 12.0
           )
        {
          // result of correctly adjusting str_count is never used.
          //if ( -1 != str_count)
          //  str_count -= end_of_inches_index;
          str_index = inches_index0 + end_of_inches_index + number_dash_count;
          if ( x < 0.0 && inches_value > 0.0 )
            x = x*12.0 - inches_value;
          else
            x = x*12.0 + inches_value;
          length_us = ON::LengthUnitSystem::Inches;
          pr.SetParseFeetInches(true);
          inches_pr.SetParseLeadingWhiteSpace(false);
          pr |= inches_pr;
          pr.SetParseWhiteSpaceBetweenFeetAndInches(bParseWhiteSpaceBetweenFeetAndInches);
        }
      }
    }
  }
  else
  {
    length_us = ON::LengthUnitSystem::None;
  }

  if ( length_value )
    *length_value = x;
  if ( 0 != parse_results )
    *parse_results = pr;
  if ( 0 != str_length_unit_system )
    *str_length_unit_system = length_us;

  return str_index;
}